

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O2

bool wallet::IsSQLiteFile(path *path)

{
  long lVar1;
  string_view source_file;
  undefined1 auVar2 [16];
  bool bVar3;
  char cVar4;
  __type_conflict _Var5;
  ulong uVar6;
  Logger *pLVar7;
  CChainParams *pCVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view logging_function;
  error_code ec;
  ifstream file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [31];
  string local_e8;
  string local_c8 [32];
  char app_id [4];
  char magic [16];
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string magic_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = std::filesystem::exists(&path->super_path);
  if (bVar3) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    uVar6 = std::filesystem::file_size(&path->super_path,&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))(local_c8);
      std::filesystem::__cxx11::path::string(&local_e8,&path->super_path);
      pLVar7 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar7);
      if (bVar3) {
        _file = (pointer)local_2e0;
        local_2e0[0]._M_local_buf[0] = '\0';
        tinyformat::format<char[13],std::__cxx11::string,std::__cxx11::string>
                  (&magic_str,(tinyformat *)"%s: %s %s\n","IsSQLiteFile",(char (*) [13])local_c8,
                   &local_e8,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   &magic_str);
        std::__cxx11::string::~string((string *)&magic_str);
        pLVar7 = LogInstance();
        magic_str._M_dataplus._M_p = (pointer)0x56;
        magic_str._M_string_length = (size_type)anon_var_dwarf_1680b28;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file._M_len = 0x56;
        logging_function._M_str = "IsSQLiteFile";
        logging_function._M_len = 0xc;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = _file;
        BCLog::Logger::LogPrintStr
                  (pLVar7,(string_view)(auVar2 << 0x40),logging_function,source_file,0x7f,ALL,Info);
        std::__cxx11::string::~string((string *)&file);
      }
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string(local_c8);
    }
    if (0x1ff < uVar6) {
      std::ifstream::ifstream<fs::path,fs::path>((ifstream *)&file,path,_S_bin);
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        bVar3 = false;
      }
      else {
        std::istream::read((char *)&file,(long)magic);
        std::istream::seekg((long)&file,0x44);
        std::istream::read((char *)&file,(long)app_id);
        std::ifstream::close();
        magic_str._M_dataplus._M_p = (pointer)&magic_str.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&magic_str,magic,local_78);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"SQLite format 3","");
        _Var5 = std::operator==(&magic_str,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (_Var5) {
          pCVar8 = Params();
          bVar3 = *(char (*) [4])(pCVar8->pchMessageStart)._M_elems == app_id;
        }
        else {
          bVar3 = false;
        }
        std::__cxx11::string::~string((string *)&magic_str);
      }
      std::ifstream::~ifstream(&file);
      goto LAB_004b26f2;
    }
  }
  bVar3 = false;
LAB_004b26f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSQLiteFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A SQLite Database file is at least 512 bytes.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 512) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    // Magic is at beginning and is 16 bytes long
    char magic[16];
    file.read(magic, 16);

    // Application id is at offset 68 and 4 bytes long
    file.seekg(68, std::ios::beg);
    char app_id[4];
    file.read(app_id, 4);

    file.close();

    // Check the magic, see https://sqlite.org/fileformat.html
    std::string magic_str(magic, 16);
    if (magic_str != std::string{"SQLite format 3\000", 16}) {
        return false;
    }

    // Check the application id matches our network magic
    return memcmp(Params().MessageStart().data(), app_id, 4) == 0;
}